

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderInstance::iterate
          (TestStatus *__return_storage_ptr__,SpvAsmComputeShaderInstance *this)

{
  int *piVar1;
  ComputeShaderSpec *pCVar2;
  pointer pSVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  ProgramBinary *binary;
  pointer pcVar4;
  VkDevice pVVar5;
  Allocation *pAVar6;
  TestStatus *pTVar7;
  bool bVar8;
  deUint32 queueFamilyIndex;
  VkResult VVar9;
  int iVar10;
  VkPhysicalDeviceFeatures *pVVar11;
  DeviceInterface *vkdi;
  Allocator *allocator;
  size_t sVar12;
  VkStructureType *pVVar13;
  void *pvVar14;
  pointer pSVar15;
  deUint64 *pdVar16;
  DescriptorPoolBuilder *this_01;
  const_iterator cVar17;
  VkQueue pVVar18;
  NotSupportedError *pNVar19;
  deUint32 ndx;
  ulong uVar20;
  VkDescriptorSetAllocateInfo *pAllocateInfo;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  VkSubmitInfo submitInfo;
  VkDevice local_270;
  AllocationMp alloc;
  VkDescriptorPool local_258;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  Move<vk::Handle<(vk::HandleType)18>_> local_208;
  Move<vk::Handle<(vk::HandleType)22>_> local_1e8;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  outputAllocs;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  TestStatus *local_160;
  long local_158;
  long local_150;
  long *local_148;
  long local_140;
  long local_138 [2];
  VkFence local_128;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_120;
  VkPipeline local_108;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_100;
  VkSemaphore local_e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_e0;
  VkPipelineLayout local_c8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_c0;
  VkDescriptorSetLayout local_a8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_a0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  outputBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  inputBuffers;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> inputAllocs
  ;
  
  pVVar11 = Context::getDeviceFeatures((this->super_TestInstance).m_context);
  vkdi = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_270 = Context::getDevice((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  if (((this->m_features | COMPUTE_TEST_USES_INT64) == COMPUTE_TEST_USES_INT16_INT64) &&
     (pVVar11->shaderInt16 == 0)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    submitInfo._0_8_ = &submitInfo.waitSemaphoreCount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&submitInfo,"shaderInt16 feature is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&submitInfo);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_160 = __return_storage_ptr__;
  if (((this->m_features & ~COMPUTE_TEST_USES_INT16) == COMPUTE_TEST_USES_INT64) &&
     (pVVar11->shaderInt64 == 0)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    submitInfo._0_8_ = &submitInfo.waitSemaphoreCount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&submitInfo,"shaderInt64 feature is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&submitInfo);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar2 = this->m_shaderSpec;
  pSVar15 = (pCVar2->inputs).
            super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (pCVar2->inputs).
           super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = (long)pSVar3 - (long)pSVar15;
  local_150 = (long)(pCVar2->outputs).
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->outputs).
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != pSVar15) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
      sVar12 = (**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar22) + 0x10))();
      pVVar13 = (VkStructureType *)operator_new(0x20);
      anon_unknown.dwarf_adba40::createBufferAndBindMemory
                ((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,vkdi,&local_270,allocator,
                 sVar12,&alloc);
      pAVar6 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr;
      pVVar13[4] = submitInfo.waitSemaphoreCount;
      pVVar13[5] = submitInfo._20_4_;
      pVVar13[6] = (VkStructureType)submitInfo.pWaitSemaphores;
      pVVar13[7] = submitInfo.pWaitSemaphores._4_4_;
      *pVVar13 = submitInfo.sType;
      pVVar13[1] = submitInfo._4_4_;
      pVVar13[2] = (VkStructureType)submitInfo.pNext;
      pVVar13[3] = submitInfo.pNext._4_4_;
      pvVar14 = (void *)(**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar22) + 0x18))();
      memcpy(pAVar6->m_hostPtr,pvVar14,sVar12);
      ::vk::flushMappedMemoryRange
                (vkdi,local_270,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,
                 sVar12);
      submitInfo._0_8_ = *(undefined8 *)pVVar13;
      submitInfo.pNext = (void *)0x0;
      submitInfo._16_8_ = sVar12;
      if (descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
        _M_realloc_insert<vk::VkDescriptorBufferInfo>
                  (&descriptorInfos,
                   (iterator)
                   descriptorInfos.
                   super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(VkDescriptorBufferInfo *)&submitInfo)
        ;
      }
      else {
        (descriptorInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->range = sVar12;
        ((descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)->buffer).m_internal = submitInfo._0_8_;
        (descriptorInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->offset = 0;
        descriptorInfos.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             descriptorInfos.
             super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      submitInfo.pNext = (void *)0x0;
      submitInfo._0_8_ = pVVar13;
      submitInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
      *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d53460;
      *(VkStructureType **)((long)submitInfo.pNext + 0x10) = pVVar13;
      *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                  *)&inputBuffers,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
      if (submitInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          submitInfo._4_4_ = 0;
          (**(code **)(*submitInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (submitInfo.pNext != (void *)0x0)) {
          (**(code **)(*submitInfo.pNext + 8))();
        }
      }
      pAVar6 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr;
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
      submitInfo.pNext = (void *)0x0;
      submitInfo._0_8_ = pAVar6;
      submitInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
      *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d552c8;
      *(Allocation **)((long)submitInfo.pNext + 0x10) = pAVar6;
      *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
      std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
      emplace_back<de::SharedPtr<vk::Allocation>>
                ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                  *)&inputAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
      if (submitInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          submitInfo._4_4_ = 0;
          (**(code **)(*submitInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (submitInfo.pNext != (void *)0x0) {
            (**(code **)(*submitInfo.pNext + 8))();
          }
          submitInfo.pNext = (void *)0x0;
        }
      }
      if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
          (Allocation *)0x0) {
        (*(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
          _vptr_Allocation[1])();
        alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)0x0;
      }
      uVar21 = uVar21 + 1;
      pSVar15 = (this->m_shaderSpec->inputs).
                super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x10;
    } while (uVar21 < (ulong)((long)(this->m_shaderSpec->inputs).
                                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 4)
            );
  }
  pSVar15 = (this->m_shaderSpec->outputs).
            super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_shaderSpec->outputs).
      super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar15) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
      sVar12 = (**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar22) + 0x10))();
      pdVar16 = (deUint64 *)operator_new(0x20);
      anon_unknown.dwarf_adba40::createBufferAndBindMemory
                ((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,vkdi,&local_270,allocator,
                 sVar12,&alloc);
      pAVar6 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr;
      pdVar16[2] = submitInfo._16_8_;
      pdVar16[3] = (deUint64)submitInfo.pWaitSemaphores;
      *pdVar16 = submitInfo._0_8_;
      pdVar16[1] = (deUint64)submitInfo.pNext;
      memset((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
             )->m_hostPtr,0xff,sVar12);
      ::vk::flushMappedMemoryRange
                (vkdi,local_270,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,
                 sVar12);
      submitInfo._0_8_ = *pdVar16;
      submitInfo.pNext = (void *)0x0;
      submitInfo._16_8_ = sVar12;
      if (descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
        _M_realloc_insert<vk::VkDescriptorBufferInfo>
                  (&descriptorInfos,
                   (iterator)
                   descriptorInfos.
                   super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(VkDescriptorBufferInfo *)&submitInfo)
        ;
      }
      else {
        (descriptorInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->range = sVar12;
        ((descriptorInfos.
          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)->buffer).m_internal = submitInfo._0_8_;
        (descriptorInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->offset = 0;
        descriptorInfos.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             descriptorInfos.
             super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      submitInfo.pNext = (void *)0x0;
      submitInfo._0_8_ = pdVar16;
      submitInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
      *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d53460;
      *(deUint64 **)((long)submitInfo.pNext + 0x10) = pdVar16;
      *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                  *)&outputBuffers,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
      if (submitInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          submitInfo._4_4_ = 0;
          (**(code **)(*submitInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (submitInfo.pNext != (void *)0x0)) {
          (**(code **)(*submitInfo.pNext + 8))();
        }
      }
      pAVar6 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr;
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
      submitInfo.pNext = (void *)0x0;
      submitInfo._0_8_ = pAVar6;
      submitInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
      *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d552c8;
      *(Allocation **)((long)submitInfo.pNext + 0x10) = pAVar6;
      *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
      *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
      std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
      emplace_back<de::SharedPtr<vk::Allocation>>
                ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                  *)&outputAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
      if (submitInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          submitInfo._4_4_ = 0;
          (**(code **)(*submitInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)submitInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (submitInfo.pNext != (void *)0x0) {
            (**(code **)(*submitInfo.pNext + 8))();
          }
          submitInfo.pNext = (void *)0x0;
        }
      }
      if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
          (Allocation *)0x0) {
        (*(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
          _vptr_Allocation[1])();
        alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)0x0;
      }
      uVar21 = uVar21 + 1;
      pSVar15 = (this->m_shaderSpec->outputs).
                super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x10;
    } while (uVar21 < (ulong)((long)(this->m_shaderSpec->outputs).
                                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 4)
            );
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&submitInfo);
  pvVar23 = (void *)((local_150 >> 4) + (local_158 >> 4));
  pVVar5 = local_270;
  for (pvVar14 = pvVar23; local_270 = pVVar5, pvVar14 != (void *)0x0;
      pvVar14 = (void *)((long)pvVar14 + -1)) {
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)&submitInfo,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
               (VkSampler *)0x0);
    pVVar5 = local_270;
  }
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&alloc,
             (DescriptorSetLayoutBuilder *)&submitInfo,vkdi,pVVar5,0);
  if (submitInfo.pCommandBuffers != (VkCommandBuffer *)0x0) {
    operator_delete(submitInfo.pCommandBuffers,
                    (long)submitInfo.pSignalSemaphores - (long)submitInfo.pCommandBuffers);
  }
  if (submitInfo.pWaitSemaphores != (VkSemaphore *)0x0) {
    operator_delete(submitInfo.pWaitSemaphores,submitInfo._40_8_ - (long)submitInfo.pWaitSemaphores)
    ;
  }
  if (submitInfo._0_8_ != 0) {
    operator_delete((void *)submitInfo._0_8_,submitInfo._16_8_ - submitInfo._0_8_);
  }
  local_a8.m_internal =
       (deUint64)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  DStack_a0.m_deviceIface =
       (DeviceInterface *)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  submitInfo.pWaitSemaphores = &local_e8;
  local_e8.m_internal =
       (deUint64)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 1;
  submitInfo.pWaitDstStageMask =
       (VkPipelineStageFlags *)((ulong)submitInfo.pWaitDstStageMask._4_4_ << 0x20);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&alloc,vkdi,pVVar5,
             (VkPipelineLayoutCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  local_c8.m_internal =
       (deUint64)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  DStack_c0.m_deviceIface =
       (DeviceInterface *)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&alloc);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&alloc,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (deUint32)pvVar23);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&submitInfo,this_01,vkdi,pVVar5,1,1);
  if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    operator_delete(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                    m_data.ptr,
                    local_258.m_internal -
                    (long)alloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr);
  }
  pVVar5 = local_270;
  local_e8.m_internal = submitInfo._0_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  DStack_e0.m_device = (VkDevice)submitInfo._16_8_;
  DStack_e0.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_108.m_internal = local_a8.m_internal;
  pAllocateInfo = (VkDescriptorSetAllocateInfo *)&alloc;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)
       CONCAT44(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                ptr._4_4_,0x22);
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
  ::vk::allocateDescriptorSet(&local_1e8,vkdi,local_270,pAllocateInfo);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&submitInfo);
  if (pvVar23 != (void *)0x0) {
    pvVar14 = (void *)0x0;
    do {
      ::vk::DescriptorSetUpdateBuilder::write
                ((DescriptorSetUpdateBuilder *)&submitInfo,
                 (int)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                      m_internal,pvVar14,0);
      pvVar14 = (void *)(ulong)((int)pvVar14 + 1);
    } while (pvVar14 < pvVar23);
  }
  ::vk::DescriptorSetUpdateBuilder::update((DescriptorSetUpdateBuilder *)&submitInfo,vkdi,pVVar5);
  if (submitInfo.pCommandBuffers != (VkCommandBuffer *)0x0) {
    operator_delete(submitInfo.pCommandBuffers,
                    (long)submitInfo.pSignalSemaphores - (long)submitInfo.pCommandBuffers);
  }
  if (submitInfo.pWaitSemaphores != (VkSemaphore *)0x0) {
    operator_delete(submitInfo.pWaitSemaphores,submitInfo._40_8_ - (long)submitInfo.pWaitSemaphores)
    ;
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&submitInfo);
  local_188 = (undefined4)
              local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  uStack_184 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal.
               _4_4_;
  uStack_180 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ._0_4_;
  uStack_17c = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ._4_4_;
  local_178 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device._0_4_
  ;
  uStack_174 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device.
               _4_4_;
  uStack_170 = (undefined4)
               local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal;
  uStack_16c = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal._4_4_;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  submitInfo._0_8_ = &submitInfo.waitSemaphoreCount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&submitInfo,"compute","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&submitInfo);
  binary = *(ProgramBinary **)(cVar17._M_node + 2);
  if ((deUint32 *)submitInfo._0_8_ != &submitInfo.waitSemaphoreCount) {
    operator_delete((void *)submitInfo._0_8_,submitInfo._16_8_ + 1);
  }
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&submitInfo,vkdi,pVVar5,binary,0);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)submitInfo._0_8_;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)submitInfo._16_8_;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       (deUint64)submitInfo.pWaitSemaphores;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       submitInfo._0_8_;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)submitInfo.pNext;
  pCVar2 = this->m_shaderSpec;
  submitInfo._56_8_ = (pCVar2->entryPoint)._M_dataplus._M_p;
  uVar21 = (long)(pCVar2->specConstants).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pCVar2->specConstants).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  iVar10 = (int)uVar21;
  if (iVar10 == 0) {
    pAllocateInfo = (VkDescriptorSetAllocateInfo *)0x0;
  }
  else {
    uVar21 = uVar21 & 0xffffffff;
    std::vector<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>::resize
              ((vector<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                *)&cmdBufferBeginInfo,uVar21);
    lVar22 = 0;
    uVar20 = 0;
    do {
      *(int *)(cmdBufferBeginInfo._0_8_ + lVar22 * 4) = (int)uVar20;
      *(int *)(cmdBufferBeginInfo._0_8_ + 4 + lVar22 * 4) = (int)lVar22;
      *(undefined8 *)(cmdBufferBeginInfo._0_8_ + 8 + lVar22 * 4) = 4;
      uVar20 = uVar20 + 1;
      lVar22 = lVar22 + 4;
    } while (uVar21 != uVar20);
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)
         CONCAT44(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                  .ptr._4_4_,iVar10);
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_ =
         cmdBufferBeginInfo.sType;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ =
         cmdBufferBeginInfo._4_4_;
  }
  pVVar5 = local_270;
  submitInfo.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo._16_8_ = submitInfo._16_8_ & 0xffffffff00000000;
  submitInfo.pWaitSemaphores = (VkSemaphore *)CONCAT44(submitInfo.pWaitSemaphores._4_4_,0x12);
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0x20;
  submitInfo.pSignalSemaphores = (VkSemaphore *)pAllocateInfo;
  ::vk::createComputePipeline
            (&local_208,vkdi,local_270,(VkPipelineCache)0x0,
             (VkComputePipelineCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  pTVar7 = local_160;
  if (cmdBufferBeginInfo._0_8_ != 0) {
    operator_delete((void *)cmdBufferBeginInfo._0_8_,
                    cmdBufferBeginInfo._16_8_ - cmdBufferBeginInfo._0_8_);
  }
  local_108.m_internal =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  DStack_100.m_deviceIface =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vkdi,pVVar5,0,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)submitInfo._0_8_;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
       submitInfo.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vkdi,pVVar5,
             (VkCommandPool)submitInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device._0_4_ =
       submitInfo.waitSemaphoreCount;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device._4_4_ =
       submitInfo._20_4_;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ =
       (VkStructureType)submitInfo.pWaitSemaphores;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._4_4_ =
       submitInfo.pWaitSemaphores._4_4_;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       submitInfo._0_8_;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)submitInfo.pNext;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  pCVar2 = this->m_shaderSpec;
  VVar9 = (*vkdi->_vptr_DeviceInterface[0x49])(vkdi,submitInfo._0_8_);
  ::vk::checkResult(VVar9,"vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x170);
  (*vkdi->_vptr_DeviceInterface[0x4c])
            (vkdi,local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal,
             1,local_108.m_internal);
  (*vkdi->_vptr_DeviceInterface[0x56])
            (vkdi,local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal,
             1,local_c8.m_internal,0,1,&local_188,0,0);
  (*vkdi->_vptr_DeviceInterface[0x5d])
            (vkdi,local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal,
             (ulong)(uint)(pCVar2->numWorkGroups).m_data[0],
             (ulong)(uint)(pCVar2->numWorkGroups).m_data[1]);
  VVar9 = (*vkdi->_vptr_DeviceInterface[0x4a])
                    (vkdi,local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                          m_internal);
  ::vk::checkResult(VVar9,"vkdi.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x174);
  pVVar5 = local_270;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vkdi,local_270,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_120.m_device = (VkDevice)submitInfo._16_8_;
  DStack_120.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_128.m_internal = submitInfo._0_8_;
  DStack_120.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_208;
  pVVar18 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  VVar9 = (*vkdi->_vptr_DeviceInterface[2])(vkdi,pVVar18,1,&submitInfo,local_128.m_internal);
  ::vk::checkResult(VVar9,
                    "vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x187);
  VVar9 = (*vkdi->_vptr_DeviceInterface[0x16])(vkdi,pVVar5,1,&local_128,0,0xffffffffffffffff);
  ::vk::checkResult(VVar9,
                    "vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x188);
  pCVar2 = this->m_shaderSpec;
  if (pCVar2->verifyIO ==
      (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
       *)0x0) {
    pSVar15 = (this->m_shaderSpec->outputs).
              super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_shaderSpec->outputs).
        super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar15) {
      lVar22 = 0;
      uVar21 = 0;
      do {
        pvVar23 = (void *)(**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar22) + 0x18))();
        pvVar14 = *(void **)(*(long *)((long)&(outputAllocs.
                                               super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                      lVar22) + 0x18);
        sVar12 = (**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar22) + 0x10))();
        iVar10 = bcmp(pvVar23,pvVar14,sVar12);
        if (iVar10 != 0) {
          pCVar2 = this->m_shaderSpec;
          pTVar7->m_code = pCVar2->failResult;
          (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
          pcVar4 = (pCVar2->failMessage)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar7->m_description,pcVar4,
                     pcVar4 + (pCVar2->failMessage)._M_string_length);
          goto LAB_005991d2;
        }
        uVar21 = uVar21 + 1;
        pSVar15 = (this->m_shaderSpec->outputs).
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = lVar22 + 0x10;
      } while (uVar21 < (ulong)((long)(this->m_shaderSpec->outputs).
                                      super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >>
                               4));
    }
  }
  else {
    bVar8 = (*pCVar2->verifyIO)(&pCVar2->inputs,&outputAllocs,&pCVar2->outputs,
                                ((this->super_TestInstance).m_context)->m_testCtx->m_log);
    if (!bVar8) {
      pCVar2 = this->m_shaderSpec;
      pTVar7->m_code = pCVar2->failResult;
      (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
      pcVar4 = (pCVar2->failMessage)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar7->m_description,pcVar4,
                 pcVar4 + (pCVar2->failMessage)._M_string_length);
      goto LAB_005991d2;
    }
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"Output match with expected","");
  pTVar7->m_code = QP_TEST_RESULT_PASS;
  (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar7->m_description,local_148,local_140 + (long)local_148);
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
LAB_005991d2:
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_120,local_128);
  }
  if (local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    submitInfo._0_8_ =
         local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    (*(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
               ,CONCAT44(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                         m_device._4_4_,
                         (deUint32)
                         local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                         m_device),
               CONCAT44(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                        m_allocator._4_4_,
                        local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                        m_allocator._0_4_),1);
  }
  if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,
               (VkCommandPool)
               alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr);
  }
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_100,local_108);
  }
  if (local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter,
               (VkShaderModule)
               local_1e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal);
  }
  if (CONCAT44(uStack_184,local_188) != 0) {
    submitInfo._0_8_ = CONCAT44(uStack_184,local_188);
    (**(code **)(*(long *)CONCAT44(uStack_17c,uStack_180) + 0x1e8))
              ((long *)CONCAT44(uStack_17c,uStack_180),CONCAT44(uStack_174,local_178),
               CONCAT44(uStack_16c,uStack_170),1);
  }
  if (local_e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&DStack_e0,(VkDescriptorPool)local_e8.m_internal);
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_c0,local_c8);
  }
  if (local_a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_a0,local_a8);
  }
  if (descriptorInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descriptorInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descriptorInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descriptorInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&outputBuffers);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&inputBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector(&outputAllocs);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector(&inputAllocs);
  return pTVar7;
}

Assistant:

tcu::TestStatus SpvAsmComputeShaderInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&		features = m_context.getDeviceFeatures();
	const DeviceInterface&				vkdi				= m_context.getDeviceInterface();
	const VkDevice&						device				= m_context.getDevice();
	Allocator&							allocator			= m_context.getDefaultAllocator();

	if ((m_features == COMPUTE_TEST_USES_INT16 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt16)
	{
		throw tcu::NotSupportedError("shaderInt16 feature is not supported");
	}

	if ((m_features == COMPUTE_TEST_USES_INT64 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt64)
	{
		throw tcu::NotSupportedError("shaderInt64 feature is not supported");
	}

	vector<AllocationSp>				inputAllocs;
	vector<AllocationSp>				outputAllocs;
	vector<BufferHandleSp>				inputBuffers;
	vector<BufferHandleSp>				outputBuffers;
	vector<VkDescriptorBufferInfo>		descriptorInfos;

	DE_ASSERT(!m_shaderSpec.outputs.empty());
	const size_t						numBuffers			= m_shaderSpec.inputs.size() + m_shaderSpec.outputs.size();

	// Create buffer object, allocate storage, and create view for all input/output buffers.

	for (size_t inputNdx = 0; inputNdx < m_shaderSpec.inputs.size(); ++inputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		input		= m_shaderSpec.inputs[inputNdx];
		const size_t		numBytes	= input->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		setMemory(vkdi, device, &*alloc, numBytes, input->data());
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		inputBuffers.push_back(BufferHandleSp(buffer));
		inputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		output		= m_shaderSpec.outputs[outputNdx];
		const size_t		numBytes	= output->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		fillMemoryWithValue(vkdi, device, &*alloc, numBytes, 0xff);
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		outputBuffers.push_back(BufferHandleSp(buffer));
		outputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	// Create layouts and descriptor set.

	Unique<VkDescriptorSetLayout>		descriptorSetLayout	(createDescriptorSetLayout(vkdi, device, numBuffers));
	Unique<VkPipelineLayout>			pipelineLayout		(createPipelineLayout(vkdi, device, *descriptorSetLayout));
	Unique<VkDescriptorPool>			descriptorPool		(createDescriptorPool(vkdi, device, (deUint32)numBuffers));
	Unique<VkDescriptorSet>				descriptorSet		(createDescriptorSet(vkdi, device, *descriptorPool, *descriptorSetLayout, numBuffers, descriptorInfos));

	// Create compute shader and pipeline.

	const ProgramBinary&				binary				= m_context.getBinaryCollection().get("compute");
	Unique<VkShaderModule>				module				(createShaderModule(vkdi, device, binary, (VkShaderModuleCreateFlags)0u));

	Unique<VkPipeline>					computePipeline		(createComputePipeline(vkdi, device, *pipelineLayout, *module, m_shaderSpec.entryPoint.c_str(), m_shaderSpec.specConstants));

	// Create command buffer and record commands

	const Unique<VkCommandPool>			cmdPool				(createCommandPool(vkdi, device, m_context.getUniversalQueueFamilyIndex()));
	Unique<VkCommandBuffer>				cmdBuffer			(allocateCommandBuffer(vkdi, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkCommandBufferBeginInfo		cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// sType
		DE_NULL,										// pNext
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const tcu::IVec3&				numWorkGroups		= m_shaderSpec.numWorkGroups;

	VK_CHECK(vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vkdi.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);
	vkdi.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0, 1, &descriptorSet.get(), 0, DE_NULL);
	vkdi.cmdDispatch(*cmdBuffer, numWorkGroups.x(), numWorkGroups.y(), numWorkGroups.z());
	VK_CHECK(vkdi.endCommandBuffer(*cmdBuffer));

	// Create fence and run.

	const Unique<VkFence>			cmdCompleteFence	(createFence(vkdi, device));
	const deUint64					infiniteTimeout		= ~(deUint64)0u;
	const VkSubmitInfo				submitInfo			=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence));
	VK_CHECK(vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure

	// Check output.
	if (m_shaderSpec.verifyIO)
	{
		if (!(*m_shaderSpec.verifyIO)(m_shaderSpec.inputs, outputAllocs, m_shaderSpec.outputs, m_context.getTestContext().getLog()))
			return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
	}
	else
	{
		for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
		{
			const BufferSp& expectedOutput = m_shaderSpec.outputs[outputNdx];
			if (deMemCmp(expectedOutput->data(), outputAllocs[outputNdx]->getHostPtr(), expectedOutput->getNumBytes()))
				return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
		}
	}

	return tcu::TestStatus::pass("Output match with expected");
}